

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

bool __thiscall VcprojGenerator::otherFiltersContain(VcprojGenerator *this,QString *fileName)

{
  char16_t *pcVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  VCFilter *local_88 [4];
  VCFilter *local_68;
  VCFilter *local_60;
  VCFilter *local_58;
  VCFilter *local_50;
  VCFilter *local_48;
  VCFilter *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88[0] = &(this->vcProject).RootFiles;
  local_88[1] = &(this->vcProject).SourceFiles;
  local_88[2] = &(this->vcProject).HeaderFiles;
  local_88[3] = &(this->vcProject).GeneratedFiles;
  local_68 = &(this->vcProject).LexYaccFiles;
  local_60 = &(this->vcProject).TranslationFiles;
  local_58 = &(this->vcProject).FormFiles;
  local_50 = &(this->vcProject).ResourceFiles;
  local_48 = &(this->vcProject).DeploymentFiles;
  local_40 = &(this->vcProject).DistributionFiles;
  pcVar1 = (fileName->d).ptr;
  lVar2 = (fileName->d).size;
  bVar9 = true;
  lVar4 = 0;
  do {
    lVar5 = *(long *)(*(long *)((long)local_88 + lVar4) + 0x68);
    lVar8 = *(long *)(*(long *)((long)local_88 + lVar4) + 0x70);
    lVar7 = lVar8 * 0x20 + lVar5;
    lVar8 = lVar8 >> 2;
    if (0 < lVar8) {
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 0x40;
      do {
        lVar6 = lVar5;
        if ((*(long *)(lVar6 + -0x28) == lVar2) &&
           (QVar10.m_data = *(storage_type_conflict **)(lVar6 + -0x30),
           QVar10.m_size = *(long *)(lVar6 + -0x28), QVar17.m_data = pcVar1, QVar17.m_size = lVar2,
           cVar3 = QtPrivate::equalStrings(QVar10,QVar17), cVar3 != '\0')) {
          lVar6 = lVar6 + -0x40;
          goto LAB_002460de;
        }
        if ((*(long *)(lVar6 + -8) == lVar2) &&
           (QVar11.m_data = *(storage_type_conflict **)(lVar6 + -0x10),
           QVar11.m_size = *(long *)(lVar6 + -8), QVar18.m_data = pcVar1, QVar18.m_size = lVar2,
           cVar3 = QtPrivate::equalStrings(QVar11,QVar18), cVar3 != '\0')) {
          lVar6 = lVar6 + -0x20;
          goto LAB_002460de;
        }
        if ((*(long *)(lVar6 + 0x18) == lVar2) &&
           (QVar12.m_data = *(storage_type_conflict **)(lVar6 + 0x10),
           QVar12.m_size = *(long *)(lVar6 + 0x18), QVar19.m_data = pcVar1, QVar19.m_size = lVar2,
           cVar3 = QtPrivate::equalStrings(QVar12,QVar19), cVar3 != '\0')) goto LAB_002460de;
        if ((*(long *)(lVar6 + 0x38) == lVar2) &&
           (QVar13.m_data = *(storage_type_conflict **)(lVar6 + 0x30),
           QVar13.m_size = *(long *)(lVar6 + 0x38), QVar20.m_data = pcVar1, QVar20.m_size = lVar2,
           cVar3 = QtPrivate::equalStrings(QVar13,QVar20), cVar3 != '\0')) {
          lVar6 = lVar6 + 0x20;
          goto LAB_002460de;
        }
        lVar8 = lVar8 + -1;
        lVar5 = lVar6 + 0x80;
      } while (1 < lVar8);
      lVar5 = lVar6 + 0x40;
    }
    lVar8 = lVar7 - lVar5 >> 5;
    if (lVar8 == 1) {
LAB_002460a8:
      lVar6 = lVar7;
      if ((*(long *)(lVar5 + 0x18) == lVar2) &&
         (QVar16.m_data = *(storage_type_conflict **)(lVar5 + 0x10),
         QVar16.m_size = *(long *)(lVar5 + 0x18), QVar23.m_data = pcVar1, QVar23.m_size = lVar2,
         cVar3 = QtPrivate::equalStrings(QVar16,QVar23), lVar6 = lVar5, cVar3 == '\0')) {
        lVar6 = lVar7;
      }
    }
    else if (lVar8 == 2) {
LAB_00246088:
      if ((*(long *)(lVar5 + 0x18) != lVar2) ||
         (QVar15.m_data = *(storage_type_conflict **)(lVar5 + 0x10),
         QVar15.m_size = *(long *)(lVar5 + 0x18), QVar22.m_data = pcVar1, QVar22.m_size = lVar2,
         cVar3 = QtPrivate::equalStrings(QVar15,QVar22), lVar6 = lVar5, cVar3 == '\0')) {
        lVar5 = lVar5 + 0x20;
        goto LAB_002460a8;
      }
    }
    else {
      lVar6 = lVar7;
      if ((lVar8 == 3) &&
         ((*(long *)(lVar5 + 0x18) != lVar2 ||
          (QVar14.m_data = *(storage_type_conflict **)(lVar5 + 0x10),
          QVar14.m_size = *(long *)(lVar5 + 0x18), QVar21.m_data = pcVar1, QVar21.m_size = lVar2,
          cVar3 = QtPrivate::equalStrings(QVar14,QVar21), lVar6 = lVar5, cVar3 == '\0')))) {
        lVar5 = lVar5 + 0x20;
        goto LAB_00246088;
      }
    }
LAB_002460de:
    if (lVar6 != lVar7) break;
    lVar4 = lVar4 + 8;
    bVar9 = lVar4 != 0x50;
  } while (bVar9);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool VcprojGenerator::otherFiltersContain(const QString &fileName) const
{
    auto filterFileMatches = [&fileName] (const VCFilterFile &ff)
    {
        return ff.file == fileName;
    };
    for (const VCFilter *filter : { &vcProject.RootFiles,
                                    &vcProject.SourceFiles,
                                    &vcProject.HeaderFiles,
                                    &vcProject.GeneratedFiles,
                                    &vcProject.LexYaccFiles,
                                    &vcProject.TranslationFiles,
                                    &vcProject.FormFiles,
                                    &vcProject.ResourceFiles,
                                    &vcProject.DeploymentFiles,
                                    &vcProject.DistributionFiles}) {
        if (std::any_of(filter->Files.cbegin(), filter->Files.cend(), filterFileMatches))
            return true;
    }
    return false;
}